

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

void __thiscall wasm::RemoveUnusedBrs::visitThrow(RemoveUnusedBrs *this,Throw *curr)

{
  PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *this_00;
  pointer ppEVar1;
  uintptr_t uVar2;
  size_t sVar3;
  char *pcVar4;
  Module *wasm;
  size_t sVar5;
  pointer pppEVar6;
  bool bVar7;
  Expression *pEVar8;
  TupleMake *pTVar9;
  Break *pBVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Builder local_48;
  Builder builder;
  
  ppEVar1 = (this->catchers).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar11 = (int)((ulong)((long)(this->catchers).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3) - 1
  ;
  if (-1 < (int)uVar11) {
    while (pEVar8 = ppEVar1[uVar11], pEVar8->_id == TryTableId) {
      if (*(ulong *)(pEVar8 + 2) != 0) {
        uVar13 = 0;
        uVar15 = 1;
        do {
          lVar14 = uVar13 * 0x10;
          pcVar12 = *(char **)(pEVar8[1].type.id + 8 + lVar14);
          if ((pcVar12 == (curr->tag).super_IString.str._M_str) || (pcVar12 == (char *)0x0)) {
            if (uVar13 < *(ulong *)(pEVar8 + 6)) {
              if (*(char *)(pEVar8[5].type.id + uVar13) != '\0') {
                return;
              }
              if (uVar13 < *(ulong *)(pEVar8 + 4)) {
                this_00 = &(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                ;
                uVar2 = pEVar8[3].type.id;
                sVar3 = *(size_t *)(uVar2 + lVar14);
                pcVar4 = *(char **)(uVar2 + 8 + lVar14);
                wasm = (this->
                       super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                       ).
                       super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       .
                       super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       .currModule;
                local_48.wasm = wasm;
                if (pcVar12 != (char *)0x0) {
                  sVar5 = (curr->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
                  if (sVar5 == 0) {
                    pTVar9 = (TupleMake *)0x0;
                  }
                  else if (sVar5 == 1) {
                    pTVar9 = (TupleMake *)
                             *(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .data;
                  }
                  else {
                    pTVar9 = Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
                                       (&local_48,&curr->operands);
                  }
                  pBVar10 = (Break *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x30,8);
                  (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id
                       = BreakId;
                  (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type
                  .id = 1;
                  (pBVar10->name).super_IString.str._M_len = sVar3;
                  (pBVar10->name).super_IString.str._M_str = pcVar4;
                  pBVar10->value = (Expression *)pTVar9;
                  pBVar10->condition = (Expression *)0x0;
                  Break::finalize(pBVar10);
                  Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                  replaceCurrent(&this_00->
                                  super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                 ,(Expression *)pBVar10);
                  return;
                }
                pBVar10 = (Break *)MixedArena::allocSpace(&wasm->allocator,0x30,8);
                (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
                     BreakId;
                (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.
                id = 1;
                (pBVar10->name).super_IString.str._M_len = sVar3;
                (pBVar10->name).super_IString.str._M_str = pcVar4;
                pBVar10->value = (Expression *)0x0;
                pBVar10->condition = (Expression *)0x0;
                builder.wasm = (Module *)this_00;
                Break::finalize(pBVar10);
                pEVar8 = getDroppedChildrenAndAppend
                                   ((Expression *)curr,wasm,
                                    &((this->
                                      super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                                      ).super_Pass.runner)->options,(Expression *)pBVar10,
                                    IgnoreParentEffects);
                Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                replaceCurrent((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                *)builder.wasm,pEVar8);
                pppEVar6 = (this->flows).
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                if ((this->flows).
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pppEVar6) {
                  return;
                }
                (this->flows).
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_finish = pppEVar6;
                return;
              }
              pcVar12 = 
              "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
              ;
            }
            else {
              pcVar12 = 
              "T &ArenaVectorBase<ArenaVector<bool>, bool>::operator[](size_t) const [SubType = ArenaVector<bool>, T = bool]"
              ;
            }
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,pcVar12);
          }
          bVar7 = uVar15 < *(ulong *)(pEVar8 + 2);
          uVar13 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar7);
      }
      bVar7 = (int)uVar11 < 1;
      uVar11 = uVar11 - 1;
      if (bVar7) {
        return;
      }
    }
  }
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    // If a throw will definitely be caught, and it is not a catch with a
    // reference, then it is just a branch (i.e. the code is using exceptions as
    // control flow). Turn it into a branch here so that the rest of the pass
    // can optimize it with all other branches.
    //
    // To do so, look at the closest try and see if it will catch us, and
    // proceed outwards if not.
    auto thrownTag = curr->tag;
    for (int i = catchers.size() - 1; i >= 0; i--) {
      auto* tryy = catchers[i]->dynCast<TryTable>();
      if (!tryy) {
        // We do not handle mixtures of Try and TryTable.
        return;
      }
      for (Index j = 0; j < tryy->catchTags.size(); j++) {
        auto tag = tryy->catchTags[j];
        // The tag must match, or be a catch_all.
        if (tag == thrownTag || tag.isNull()) {
          // This must not be a catch with exnref.
          if (!tryy->catchRefs[j]) {
            // Success! Create a break to replace the throw.
            auto dest = tryy->catchDests[j];
            auto& wasm = *getModule();
            Builder builder(wasm);
            if (!tag.isNull()) {
              // We are catching a specific tag, so values might be sent.
              Expression* value = nullptr;
              if (curr->operands.size() == 1) {
                value = curr->operands[0];
              } else if (curr->operands.size() > 1) {
                value = builder.makeTupleMake(curr->operands);
              }
              auto* br = builder.makeBreak(dest, value);
              replaceCurrent(br);
              return;
            }

            // catch_all: no values are sent. Drop the throw's children (while
            // ignoring parent effects: the parent is a throw, but we have
            // proven we can remove that effect).
            auto* br = builder.makeBreak(dest);
            auto* rep = getDroppedChildrenAndAppend(
              curr, wasm, getPassOptions(), br, DropMode::IgnoreParentEffects);
            replaceCurrent(rep);
            // We modified the code here and may have added a drop, etc., so
            // stop the flow (rather than re-scan it somehow). We leave
            // optimizing anything that flows out for later iterations.
            stopFlow();
          }

          // Return even if we did not optimize: we found our tag was caught.
          return;
        }
      }
    }
  }